

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_stream_can_send(quicly_stream_t *stream,int at_stream_level)

{
  int in_ESI;
  long in_RDI;
  uint64_t blocked_at;
  ulong local_28;
  int local_4;
  
  if (*(long *)(in_RDI + 0x48) == 0) {
    local_4 = 0;
  }
  else {
    if (in_ESI == 0) {
      local_28 = *(ulong *)(in_RDI + 0x68);
    }
    else {
      local_28 = *(ulong *)(in_RDI + 0xc0);
    }
    if (**(ulong **)(in_RDI + 0x40) < local_28) {
      local_4 = 1;
    }
    else if (**(ulong **)(in_RDI + 0x40) < *(ulong *)(in_RDI + 0x70)) {
      if ((in_ESI != 0) && (*(int *)(in_RDI + 0xf8) == 0)) {
        *(undefined4 *)(in_RDI + 0xf8) = 1;
        sched_stream_control((quicly_stream_t *)0x13584c);
      }
      local_4 = 0;
    }
    else {
      if (**(long **)(in_RDI + 0x40) != *(long *)(in_RDI + 0x70)) {
        __assert_fail("stream->sendstate.pending.ranges[0].start == stream->sendstate.final_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0xd53,"int quicly_stream_can_send(quicly_stream_t *, int)");
      }
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int quicly_stream_can_send(quicly_stream_t *stream, int at_stream_level)
{
    /* return if there is nothing to be sent */
    if (stream->sendstate.pending.num_ranges == 0)
        return 0;

    /* return if flow is capped neither by MAX_STREAM_DATA nor (in case we are hitting connection-level flow control) by the number
     * of bytes we've already sent */
    uint64_t blocked_at = at_stream_level ? stream->_send_aux.max_stream_data : stream->sendstate.size_inflight;
    if (stream->sendstate.pending.ranges[0].start < blocked_at)
        return 1;
    /* we can always send EOS, if that is the only thing to be sent */
    if (stream->sendstate.pending.ranges[0].start >= stream->sendstate.final_size) {
        assert(stream->sendstate.pending.ranges[0].start == stream->sendstate.final_size);
        return 1;
    }

    /* if known to be blocked at stream-level, schedule the emission of STREAM_DATA_BLOCKED frame */
    if (at_stream_level && stream->_send_aux.blocked == QUICLY_SENDER_STATE_NONE) {
        stream->_send_aux.blocked = QUICLY_SENDER_STATE_SEND;
        sched_stream_control(stream);
    }

    return 0;
}